

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O2

int comex_gets(void *src_ptr,int *src_stride_ar,void *dst_ptr,int *dst_stride_ar,int *count,
              int stride_levels,int proc,comex_group_t group)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  char *__assertion;
  ulong uVar6;
  int iVar7;
  int size;
  int local_b4 [7];
  int src_bunit [7];
  int dst_bunit [7];
  int aiStack_58 [10];
  
  iVar1 = comex_group_size(group,&size);
  if (iVar1 == 0) {
    if (proc < 0) {
      __assertion = "proc >= 0";
    }
    else {
      if (proc < size) {
        if (group != 0) {
          comex_group_translate_world(group,proc,src_bunit);
          proc = src_bunit[0];
        }
        uVar2 = 0;
        uVar6 = 0;
        if (0 < stride_levels) {
          uVar6 = (ulong)(uint)stride_levels;
        }
        iVar1 = 1;
        for (; uVar6 != uVar2; uVar2 = uVar2 + 1) {
          iVar1 = iVar1 * count[uVar2 + 1];
        }
        local_b4[0] = 0;
        aiStack_58[1] = 0;
        src_bunit[0] = 1;
        src_bunit[1] = 1;
        dst_bunit[0] = 1;
        dst_bunit[1] = 1;
        for (lVar3 = 2; lVar3 <= stride_levels; lVar3 = lVar3 + 1) {
          local_b4[lVar3 + -1] = 0;
          aiStack_58[lVar3] = 0;
          iVar7 = count[lVar3 + -1];
          src_bunit[lVar3] = src_bunit[lVar3 + -1] * iVar7;
          dst_bunit[lVar3] = iVar7 * dst_bunit[lVar3 + -1];
        }
        if (iVar1 < 1) {
          iVar1 = 0;
        }
        iVar7 = 0;
        while (iVar7 != iVar1) {
          iVar7 = iVar7 + 1;
          lVar3 = 0;
          for (uVar2 = 0; uVar6 != uVar2; uVar2 = uVar2 + 1) {
            lVar3 = lVar3 + (long)src_stride_ar[uVar2] * (long)local_b4[uVar2];
            iVar4 = local_b4[uVar2] + (uint)(iVar7 % src_bunit[uVar2 + 1] == 0);
            if (count[uVar2 + 1] <= iVar4) {
              iVar4 = 0;
            }
            local_b4[uVar2] = iVar4;
          }
          lVar5 = 0;
          for (uVar2 = 0; uVar6 != uVar2; uVar2 = uVar2 + 1) {
            lVar5 = lVar5 + (long)dst_stride_ar[uVar2] * (long)aiStack_58[uVar2 + 1];
            iVar4 = aiStack_58[uVar2 + 1] + (uint)(iVar7 % dst_bunit[uVar2 + 1] == 0);
            if (count[uVar2 + 1] <= iVar4) {
              iVar4 = 0;
            }
            aiStack_58[uVar2 + 1] = iVar4;
          }
          _get_nbi((void *)(lVar3 + (long)src_ptr),(void *)(lVar5 + (long)dst_ptr),*count,proc);
        }
        comex_make_progress();
        return 0;
      }
      __assertion = "proc < size";
    }
  }
  else {
    __assertion = "COMEX_SUCCESS == ierr";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                ,0x359,
                "int comex_gets(void *, int *, void *, int *, int *, int, int, comex_group_t)");
}

Assistant:

int comex_gets(
        void *src_ptr, int *src_stride_ar,
        void *dst_ptr, int *dst_stride_ar,
        int *count, int stride_levels,
        int proc, comex_group_t group)
{
    int i, j;
    long src_idx, dst_idx;  /* index offset of current block position to ptr */
    int n1dim;  /* number of 1 dim block */
    int src_bvalue[7], src_bunit[7];
    int dst_bvalue[7], dst_bunit[7];

    CHECK_GROUP(group,proc);
#if DEBUG
    if (stride_levels) {
        printf("[%d] comex_gets(src_ptr=%p, src_stride_ar[0]=%d, dst_ptr=%p, dst_stride_ar[0]=%d, count[0]=%d, stride_levels=%d, proc=%d)\n",
                l_state.rank, src_ptr, src_stride_ar[0], dst_ptr, dst_stride_ar[0], count[0], stride_levels, proc);
    }
    else {
        printf("[%d] comex_gets(src_ptr=%p, src_stride_ar=NULL, dst_ptr=%p, dst_stride_ar=NULL, count=NULL, stride_levels=%d, proc=%d)\n",
                l_state.rank, src_ptr, dst_ptr, stride_levels, proc);
    }
#endif

    /* number of n-element of the first dimension */
    n1dim = 1;
    for(i=1; i<=stride_levels; i++) {
        n1dim *= count[i];
    }

    /* calculate the destination indices */
    src_bvalue[0] = 0; src_bvalue[1] = 0; src_bunit[0] = 1; src_bunit[1] = 1;
    dst_bvalue[0] = 0; dst_bvalue[1] = 0; dst_bunit[0] = 1; dst_bunit[1] = 1;

    for(i=2; i<=stride_levels; i++) {
        src_bvalue[i] = 0;
        dst_bvalue[i] = 0;
        src_bunit[i] = src_bunit[i-1] * count[i-1];
        dst_bunit[i] = dst_bunit[i-1] * count[i-1];
    }

    for(i=0; i<n1dim; i++) {
        src_idx = 0;
        for(j=1; j<=stride_levels; j++) {
	  src_idx += (long) src_bvalue[j] * (long) src_stride_ar[j-1];
            if((i+1) % src_bunit[j] == 0) {
                src_bvalue[j]++;
            }
            if(src_bvalue[j] > (count[j]-1)) {
                src_bvalue[j] = 0;
            }
        }

        dst_idx = 0;
        
        for(j=1; j<=stride_levels; j++) {
	  dst_idx += (long) dst_bvalue[j] * (long) dst_stride_ar[j-1];
            if((i+1) % dst_bunit[j] == 0) {
                dst_bvalue[j]++;
            }
            if(dst_bvalue[j] > (count[j]-1)) {
                dst_bvalue[j] = 0;
            }
        }
        
        _get_nbi((char *)src_ptr + src_idx, 
                (char *)dst_ptr + dst_idx, count[0], proc);
    }
    
    comex_wait_proc(proc, group);
    
    return COMEX_SUCCESS;
}